

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash.cpp
# Opt level: O3

ResBytes * multihash::encode(ResBytes *__return_storage_ptr__,string *digest,UInt code)

{
  Bytes *in_R8;
  Bytes out;
  Bytes dig;
  OptError err;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  Bytes local_50;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_38;
  bool local_18;
  
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  binary::decodeHex(&local_50,digest);
  encode_abi_cxx11_((OptError *)&local_38,(multihash *)&local_50,(Bytes *)(ulong)code,
                    (UInt)&local_68,in_R8);
  std::
  _Tuple_impl<0ul,std::optional<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::optional<std::__cxx11::string>>
  ::
  _Tuple_impl<std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::optional<std::__cxx11::string>&,void>
            ((_Tuple_impl<0ul,std::optional<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::optional<std::__cxx11::string>>
              *)__return_storage_ptr__,&local_68,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_38);
  if (local_18 == true) {
    local_18 = false;
    if (local_38._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_38._M_value + 0x10)) {
      operator_delete((void *)local_38._M_value._M_dataplus._M_p,local_38._16_8_ + 1);
    }
  }
  if (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ResBytes encode(std::string digest, UInt code) {
	Bytes out;
	Bytes dig = binary::decodeHex(digest);
	auto err = encode(dig, code, out);
	return {out, err};
}